

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessagesTestCase.cpp
# Opt level: O2

void __thiscall
SuiteMessageTests::TestresendRequestSetString::RunImpl(TestresendRequestSetString *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  FieldBase *pFVar3;
  TestDetails **ppTVar4;
  BeginSeqNo beginSeqNo;
  EndSeqNo endSeqNo;
  ResendRequest object;
  int local_24c;
  TestDetails local_248;
  FieldBase local_228;
  FieldBase local_1c8;
  ResendRequest local_168;
  
  FIX42::ResendRequest::ResendRequest(&local_168);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_228,"8=FIX.4.2\x019=16\x0135=2\x017=1\x0116=233\x0110=184\x01",
             (allocator<char> *)&local_1c8);
  FIX::Message::setString((Message *)&local_168,(string *)&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  FIX::BeginSeqNo::BeginSeqNo((BeginSeqNo *)&local_228);
  FIX::EndSeqNo::EndSeqNo((EndSeqNo *)&local_1c8);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_24c = 1;
  pFVar3 = FIX::FieldMap::getField((FieldMap *)&local_168,&local_228);
  ppTVar4 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_248,*ppTVar4,0x2bf);
  UnitTest::CheckEqual<int,FIX::BeginSeqNo>(pTVar1,&local_24c,(BeginSeqNo *)pFVar3,&local_248);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_24c = 0xe9;
  pFVar3 = FIX::FieldMap::getField((FieldMap *)&local_168,&local_1c8);
  ppTVar4 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_248,*ppTVar4,0x2c0);
  UnitTest::CheckEqual<int,FIX::EndSeqNo>(pTVar1,&local_24c,(EndSeqNo *)pFVar3,&local_248);
  FIX::FieldBase::~FieldBase(&local_1c8);
  FIX::FieldBase::~FieldBase(&local_228);
  FIX::Message::~Message((Message *)&local_168);
  return;
}

Assistant:

TEST(resendRequestSetString)
{
  ResendRequest object;

  object.setString
    ( "8=FIX.4.2\0019=16\00135=2\0017=1\00116=233\00110=184\001" );

  BeginSeqNo beginSeqNo;
  EndSeqNo endSeqNo;
  CHECK_EQUAL( 1, object.get( beginSeqNo ) );
  CHECK_EQUAL( 233, object.get( endSeqNo ) );
}